

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

void __thiscall
train_context::concat_diff_tmp
          (train_context *this,vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *diff_filtered)

{
  value_type pgVar1;
  void *__src;
  size_type sVar2;
  const_reference ppgVar3;
  reference this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  uchar *puVar4;
  size_t __n;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_RSI;
  size_type in_RDI;
  size_t curr_size;
  value_type *diff_tmp;
  value_type t;
  int il;
  int local_14;
  
  sVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(in_RSI);
  if ((int)sVar2 != *(int *)(in_RDI + 0xc) + -1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
               ,0xda,"GGML_ASSERT(%s) failed","(int) diff_filtered.size() == n_layers - 1");
  }
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0xc) + -1; local_14 = local_14 + 1) {
    ppgVar3 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        (in_RSI,(long)local_14);
    pgVar1 = *ppgVar3;
    this_00 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)(in_RDI + 0x70),(long)local_14);
    this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    ggml_nbytes(pgVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,in_RDI);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17e987);
    __src = pgVar1->data;
    __n = ggml_nbytes(pgVar1);
    memcpy(puVar4 + (long)this_01,__src,__n);
  }
  return;
}

Assistant:

void concat_diff_tmp(const std::vector<struct ggml_tensor *> & diff_filtered) {
        GGML_ASSERT((int) diff_filtered.size() == n_layers - 1);
        for (int il = 0; il < n_layers - 1; il++) {
            auto t = diff_filtered[il];
            auto & diff_tmp = v_diff_tmp[il];
            size_t curr_size = diff_tmp.size();
            diff_tmp.resize(curr_size + ggml_nbytes(t));
            memcpy(diff_tmp.data() + curr_size, t->data, ggml_nbytes(t));
        }
    }